

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  ulong uVar1;
  sqlite3_xauth p_Var2;
  int iVar3;
  int iVar4;
  sqlite3 *db_00;
  uchar *zDb_00;
  uchar *zSql;
  uchar *local_238;
  int i2;
  int i1;
  NameContext sNC;
  Parse sParse;
  int rc;
  sqlite3_xauth xAuth;
  int isLegacy;
  int bTemp;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  zDb_00 = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[1]);
  iVar3 = sqlite3_value_int(argv[4]);
  uVar1 = db_00->flags;
  p_Var2 = db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  if ((zDb_00 != (uchar *)0x0) && (zSql != (uchar *)0x0)) {
    sParse.pRename._4_4_ =
         renameParseSql((Parse *)&sNC.pWinSelect,(char *)zDb_00,1,db_00,(char *)zSql,iVar3);
    if (sParse.pRename._4_4_ == 0) {
      if ((((uVar1 & 0x4000000) == 0) && (sParse.zTail != (char *)0x0)) &&
         (*(long *)(sParse.zTail + 0x18) != 0)) {
        memset(&i2,0,0x38);
        _i2 = (Parse *)&sNC.pWinSelect;
        sqlite3SelectPrep((Parse *)&sNC.pWinSelect,*(Select **)(sParse.zTail + 0x18),
                          (NameContext *)&i2);
        if (sParse.nRangeReg != 0) {
          sParse.pRename._4_4_ = (int)sParse.pVdbe;
        }
      }
      else if (sParse.pNewIndex != (Index *)0x0) {
        if ((uVar1 & 0x4000000) == 0) {
          local_238 = zDb_00;
          if (iVar3 != 0) {
            local_238 = (uchar *)0x0;
          }
          sParse.pRename._4_4_ = renameResolveTrigger((Parse *)&sNC.pWinSelect,(char *)local_238);
        }
        if (sParse.pRename._4_4_ == 0) {
          iVar3 = sqlite3SchemaToIndex(db_00,(sParse.pNewIndex)->pSchema);
          iVar4 = sqlite3FindDbName(db_00,(char *)zDb_00);
          if (iVar3 == iVar4) {
            sqlite3_result_int(context,1);
          }
        }
      }
    }
    if (sParse.pRename._4_4_ != 0) {
      renameColumnParseError(context,1,argv[2],argv[3],(Parse *)&sNC.pWinSelect);
    }
    renameParseCleanup((Parse *)&sNC.pWinSelect);
  }
  db_00->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && sParse.pNewTable->pSelect ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ) sqlite3_result_int(context, 1);
        }
      }
    }

    if( rc!=SQLITE_OK ){
      renameColumnParseError(context, 1, argv[2], argv[3], &sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}